

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

void __thiscall Assimp::FIDoubleValueImpl::~FIDoubleValueImpl(FIDoubleValueImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pdVar3;
  
  (this->super_FIDoubleValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__009b3d70;
  pcVar2 = (this->strValue)._M_dataplus._M_p;
  paVar1 = &(this->strValue).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_FIDoubleValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR___cxa_pure_virtual_009b3db0;
  pdVar3 = (this->super_FIDoubleValue).value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3,(long)(this->super_FIDoubleValue).value.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar3);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

inline FIDoubleValueImpl(std::vector<double> &&value_): strValueValid(false) { value = std::move(value_); }